

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O1

void __thiscall
slang::parsing::Preprocessor::handleProtectLicense
          (Preprocessor *this,Token keyword,PragmaExpressionSyntax *args,
          SmallVectorBase<slang::parsing::Token> *param_3)

{
  PragmaExpressionSyntax *expr;
  int iVar1;
  ParenPragmaExpressionSyntax *pPVar2;
  SyntaxNode *pSVar3;
  NameValuePragmaExpressionSyntax *pNVar4;
  size_t sVar5;
  Diagnostic *pDVar6;
  SimplePragmaExpressionSyntax *pSVar7;
  char *__s1;
  ulong uVar8;
  size_type __rlen;
  size_t index;
  string_view sVar9;
  SourceRange SVar10;
  string_view arg;
  Token local_40;
  
  local_40.info = keyword.info;
  local_40._0_8_ = keyword._0_8_;
  if (args == (PragmaExpressionSyntax *)0x0) {
    SVar10 = Token::range(&local_40);
  }
  else {
    if (((args->super_SyntaxNode).kind == ParenPragmaExpression) &&
       (pPVar2 = slang::syntax::SyntaxNode::as<slang::syntax::ParenPragmaExpressionSyntax>
                           (&args->super_SyntaxNode), (pPVar2->values).elements.size_ != 0)) {
      pPVar2 = slang::syntax::SyntaxNode::as<slang::syntax::ParenPragmaExpressionSyntax>
                         (&args->super_SyntaxNode);
      uVar8 = (pPVar2->values).elements.size_ + 1;
      if (uVar8 < 2) {
        return;
      }
      index = 0;
      do {
        pSVar3 = &slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::
                  operator[](&pPVar2->values,index)->super_SyntaxNode;
        if (pSVar3->kind == NameValuePragmaExpression) {
          pNVar4 = slang::syntax::SyntaxNode::as<slang::syntax::NameValuePragmaExpressionSyntax>
                             (pSVar3);
          sVar9 = Token::valueText(&pNVar4->name);
          __s1 = sVar9._M_str;
          sVar5 = sVar9._M_len;
          if (((((sVar5 == 7) && (iVar1 = bcmp(__s1,"library",7), iVar1 == 0)) ||
               ((sVar5 == 5 && (iVar1 = bcmp(__s1,"entry",5), iVar1 == 0)))) ||
              ((sVar5 == 7 && (iVar1 = bcmp(__s1,"feature",7), iVar1 == 0)))) ||
             ((sVar5 == 4 && (iVar1 = bcmp(__s1,"exit",4), iVar1 == 0)))) {
            pSVar3 = &((pNVar4->value).ptr)->super_SyntaxNode;
            if (pSVar3 == (SyntaxNode *)0x0) {
LAB_0019da1d:
              assert::assertFailed
                        ("ptr",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                         ,0x26,
                         "T slang::not_null<slang::syntax::PragmaExpressionSyntax *>::get() const [T = slang::syntax::PragmaExpressionSyntax *]"
                        );
            }
            if ((pSVar3->kind != SimplePragmaExpression) ||
               (pSVar7 = slang::syntax::SyntaxNode::as<slang::syntax::SimplePragmaExpressionSyntax>
                                   (pSVar3), (pSVar7->value).kind != StringLiteral)) {
              pSVar3 = &((pNVar4->value).ptr)->super_SyntaxNode;
              if (pSVar3 == (SyntaxNode *)0x0) goto LAB_0019da1d;
              SVar10 = slang::syntax::SyntaxNode::sourceRange(pSVar3);
              pDVar6 = addDiag(this,(DiagCode)0x1f0004,SVar10);
              goto LAB_0019d9a5;
            }
          }
          else if ((sVar5 == 5) && (iVar1 = bcmp(__s1,"match",5), iVar1 == 0)) {
            expr = (pNVar4->value).ptr;
            if (expr == (PragmaExpressionSyntax *)0x0) goto LAB_0019da1d;
            requireUInt32(this,expr);
          }
          else if (sVar5 != 0) {
            SVar10 = Token::range(&pNVar4->name);
            pDVar6 = addDiag(this,(DiagCode)0x2e0004,SVar10);
            arg = Token::valueText(&local_40);
            pDVar6 = Diagnostic::operator<<(pDVar6,arg);
            goto LAB_0019d9a5;
          }
        }
        else {
          SVar10 = slang::syntax::SyntaxNode::sourceRange(pSVar3);
          pDVar6 = addDiag(this,(DiagCode)0x270004,SVar10);
          sVar9 = Token::valueText(&local_40);
LAB_0019d9a5:
          Diagnostic::operator<<(pDVar6,sVar9);
        }
        index = index + 1;
        if (uVar8 >> 1 == index) {
          return;
        }
      } while( true );
    }
    SVar10 = slang::syntax::SyntaxNode::sourceRange(&args->super_SyntaxNode);
  }
  pDVar6 = addDiag(this,(DiagCode)0x270004,SVar10);
  sVar9 = Token::valueText(&local_40);
  Diagnostic::operator<<(pDVar6,sVar9);
  return;
}

Assistant:

void Preprocessor::handleProtectLicense(Token keyword, const PragmaExpressionSyntax* args,
                                        SmallVectorBase<Token>&) {
    if (!args || args->kind != SyntaxKind::ParenPragmaExpression ||
        args->as<ParenPragmaExpressionSyntax>().values.empty()) {
        addDiag(diag::ProtectArgList, args ? args->sourceRange() : keyword.range())
            << keyword.valueText();
        return;
    }

    for (auto arg : args->as<ParenPragmaExpressionSyntax>().values) {
        if (arg->kind != SyntaxKind::NameValuePragmaExpression) {
            addDiag(diag::ProtectArgList, arg->sourceRange()) << keyword.valueText();
            continue;
        }

        auto& nvp = arg->as<NameValuePragmaExpressionSyntax>();
        auto name = nvp.name.valueText();
        if (name == "library"sv || name == "entry"sv || name == "feature"sv || name == "exit"sv) {
            if (nvp.value->kind != SyntaxKind::SimplePragmaExpression ||
                nvp.value->as<SimplePragmaExpressionSyntax>().value.kind !=
                    TokenKind::StringLiteral) {
                addDiag(diag::ExpectedProtectArg, nvp.value->sourceRange()) << name;
            }
        }
        else if (name == "match"sv) {
            requireUInt32(*nvp.value);
        }
        else if (!name.empty()) {
            addDiag(diag::UnknownProtectOption, nvp.name.range()) << keyword.valueText() << name;
        }
    }
}